

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::emitSphere(SemanticParser *this,SP *shape)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float fVar11;
  SP SVar12;
  SP ours;
  allocator<char> local_89;
  __shared_ptr<pbrt::Sphere,_(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 local_78 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<pbrt::Shape,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &(in_RDX->_M_ptr->material).
              super___shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>);
  findOrCreateMaterial((SemanticParser *)local_78,(SP *)shape);
  std::make_shared<pbrt::Sphere,std::shared_ptr<pbrt::Material>>
            ((shared_ptr<pbrt::Material> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  peVar1 = in_RDX->_M_ptr;
  fVar8 = (peVar1->transform).atStart.l.vx.x;
  fVar9 = (peVar1->transform).atStart.l.vx.y;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(peVar1->transform).atStart.l.vx.z;
  fVar4 = (peVar1->transform).atStart.l.vy.y;
  fVar5 = (peVar1->transform).atStart.l.vy.z;
  fVar6 = (peVar1->transform).atStart.l.vz.x;
  fVar7 = (peVar1->transform).atStart.l.vz.y;
  fVar11 = (peVar1->transform).atStart.p.y;
  fVar3 = (peVar1->transform).atStart.p.z;
  *(undefined8 *)&((local_88._M_ptr)->transform).l.vz.z =
       *(undefined8 *)&(peVar1->transform).atStart.l.vz.z;
  ((local_88._M_ptr)->transform).p.y = fVar11;
  ((local_88._M_ptr)->transform).p.z = fVar3;
  ((local_88._M_ptr)->transform).l.vy.y = fVar4;
  ((local_88._M_ptr)->transform).l.vy.z = fVar5;
  ((local_88._M_ptr)->transform).l.vz.x = fVar6;
  ((local_88._M_ptr)->transform).l.vz.y = fVar7;
  ((local_88._M_ptr)->transform).l.vx.x = fVar8;
  ((local_88._M_ptr)->transform).l.vx.y = fVar9;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&((local_88._M_ptr)->transform).l.vx.z)->_M_pi =
       p_Var2;
  peVar1 = in_RDX->_M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"radius",&local_89);
  fVar11 = syntactic::ParamSet::getParam1f
                     (&(peVar1->super_Node).super_ParamSet,(string *)local_78,0.0);
  (local_88._M_ptr)->radius = fVar11;
  std::__cxx11::string::~string((string *)local_78);
  std::__shared_ptr<pbrt::Shape,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Sphere,void>
            (local_48,&local_88);
  std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x20),
             in_RDX);
  extractTextures((SemanticParser *)shape,(SP *)local_48,(SP *)(local_78 + 0x20));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  _Var10._M_pi = local_88._M_refcount._M_pi;
  local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88._M_ptr;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  local_88._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  SVar12.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar12.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar12.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitSphere(pbrt::syntactic::Shape::SP shape)
  {
    Sphere::SP ours = std::make_shared<Sphere>(findOrCreateMaterial(shape->material));

    ours->transform = shape->transform.atStart;
    ours->radius    = shape->getParam1f("radius");
    extractTextures(ours,shape);
      
    return ours;
  }